

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscWriterNaive::PutDeferred
          (SscWriterNaive *this,VariableBase *variable,void *data)

{
  pointer *__lhs;
  pointer pBVar1;
  size_t sVar2;
  __type _Var3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  Dims *b;
  Dims vShape;
  Dims vCount;
  Dims vStart;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  BlockVec *local_58;
  string local_50 [32];
  
  if (*(int *)(variable + 0x28) == 0xe) {
    std::
    vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
    ::emplace_back<>(&this->m_Metadata);
    pBVar1 = (this->m_Metadata).
             super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_assign((string *)(pBVar1 + -1));
    pBVar1[-1].type = String;
    pBVar1[-1].shapeId = *(ShapeID *)(variable + 0x40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pBVar1[-1].shape,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pBVar1[-1].start,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pBVar1[-1].count,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
    sVar6 = (this->super_SscWriterBase).m_Buffer.m_Size;
    pBVar1[-1].bufferStart = sVar6;
    sVar2 = *(size_t *)((long)data + 8);
    pBVar1[-1].bufferCount = sVar2;
    Buffer::resize(&(this->super_SscWriterBase).m_Buffer,sVar2 + sVar6);
    memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + pBVar1[-1].bufferStart,*data,
           *(size_t *)((long)data + 8));
    std::vector<char,_std::allocator<char>_>::resize
              (&pBVar1[-1].value,*(size_type *)((long)data + 8));
    memcpy(pBVar1[-1].value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,*data,*(size_t *)((long)data + 8));
    return;
  }
  if (((*(int *)(variable + 0x40) != 4) && (*(int *)(variable + 0x40) != 1)) ||
     ((this->super_SscWriterBase).m_WriterRank == 0)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
    if (*(int *)((this->super_SscWriterBase).m_IO + 0x58) != 0) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (local_70._M_impl.super__Vector_impl_data._M_start,
                 local_70._M_impl.super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (local_88._M_impl.super__Vector_impl_data._M_start,
                 local_88._M_impl.super__Vector_impl_data._M_finish);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (local_a0._M_impl.super__Vector_impl_data._M_start,
                 local_a0._M_impl.super__Vector_impl_data._M_finish);
    }
    local_58 = &this->m_Metadata;
    pBVar1 = (this->m_Metadata).
             super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    b = &((this->m_Metadata).
          super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
          ._M_impl.super__Vector_impl_data._M_start)->start;
    bVar5 = false;
    while (__lhs = &b[-5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish, (pointer)__lhs != pBVar1) {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(variable + 8));
      if (_Var3) {
        bVar4 = AreSameDims((Dims *)&local_70,b);
        if (bVar4) {
          bVar4 = AreSameDims((Dims *)&local_88,b + 1);
          if (bVar4) {
            bVar4 = AreSameDims((Dims *)&local_a0,b + -1);
            if (bVar4) {
              memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + *(size_t *)(b + 4),data,
                     (size_t)*(pointer *)((long)(b + 4) + 8));
              bVar5 = true;
            }
          }
        }
      }
      b = b + 0xb;
    }
    if (!bVar5) {
      std::
      vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
      ::emplace_back<>(local_58);
      pBVar1 = (this->m_Metadata).
               super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_assign((string *)(pBVar1 + -1));
      pBVar1[-1].type = *(DataType *)(variable + 0x28);
      pBVar1[-1].shapeId = *(ShapeID *)(variable + 0x40);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar1[-1].shape,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar1[-1].start,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar1[-1].count,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88);
      sVar6 = *(size_t *)(variable + 0x30);
      pBVar1[-1].elementSize = sVar6;
      pBVar1[-1].bufferStart = (this->super_SscWriterBase).m_Buffer.m_Size;
      sVar6 = TotalDataSize(&pBVar1[-1].count,sVar6,&pBVar1[-1].shapeId);
      pBVar1[-1].bufferCount = sVar6;
      Buffer::resize(&(this->super_SscWriterBase).m_Buffer,sVar6 + pBVar1[-1].bufferStart);
      memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + pBVar1[-1].bufferStart,data,
             pBVar1[-1].bufferCount);
      if ((pBVar1[-1].shapeId == LocalValue) || (pBVar1[-1].shapeId == GlobalValue)) {
        std::vector<char,_std::allocator<char>_>::resize
                  (&pBVar1[-1].value,*(size_type *)(variable + 0x30));
        memcpy(pBVar1[-1].value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,data,pBVar1[-1].bufferCount);
      }
      if (*(int *)(variable + 0x28) == 0x10) {
        adios2::core::StructDefinition::StructName_abi_cxx11_();
        std::__cxx11::string::operator=((string *)&pBVar1[-1].structDef,local_50);
        std::__cxx11::string::~string(local_50);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_88);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_70);
  }
  return;
}

Assistant:

void SscWriterNaive::PutDeferred(VariableBase &variable, const void *data)
{

    if (variable.m_Type == DataType::String)
    {
        const auto dataString = reinterpret_cast<const std::string *>(data);
        m_Metadata.emplace_back();
        auto &b = m_Metadata.back();
        b.name = variable.m_Name;
        b.type = DataType::String;
        b.shapeId = variable.m_ShapeID;
        b.shape = variable.m_Shape;
        b.start = variable.m_Start;
        b.count = variable.m_Count;
        b.bufferStart = m_Buffer.size();
        b.bufferCount = dataString->size();
        m_Buffer.resize(b.bufferStart + b.bufferCount);
        std::memcpy(m_Buffer.data() + b.bufferStart, dataString->data(), dataString->size());
        b.value.resize(dataString->size());
        std::memcpy(b.value.data(), dataString->data(), dataString->size());
        return;
    }

    if ((variable.m_ShapeID == ShapeID::GlobalValue || variable.m_ShapeID == ShapeID::LocalValue ||
         variable.m_Type == DataType::String) &&
        m_WriterRank != 0)
    {
        return;
    }

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
    }

    bool found = false;
    for (const auto &b : m_Metadata)
    {
        if (b.name == variable.m_Name && ssc::AreSameDims(vStart, b.start) &&
            ssc::AreSameDims(vCount, b.count) && ssc::AreSameDims(vShape, b.shape))
        {
            std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
            found = true;
        }
    }

    if (!found)
    {
        m_Metadata.emplace_back();
        auto &b = m_Metadata.back();
        b.name = variable.m_Name;
        b.type = variable.m_Type;
        b.shapeId = variable.m_ShapeID;
        b.shape = vShape;
        b.start = vStart;
        b.count = vCount;
        b.elementSize = variable.m_ElementSize;
        b.bufferStart = m_Buffer.size();
        b.bufferCount = ssc::TotalDataSize(b.count, b.elementSize, b.shapeId);
        m_Buffer.resize(b.bufferStart + b.bufferCount);
        std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
        if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
        {
            b.value.resize(variable.m_ElementSize);
            std::memcpy(b.value.data(), data, b.bufferCount);
        }
        if (variable.m_Type == DataType::Struct)
        {
            b.structDef = reinterpret_cast<VariableStruct *>(&variable)
                              ->m_WriteStructDefinition->StructName();
        }
    }
}